

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-demo.cpp
# Opt level: O3

void __thiscall ExampleAppDocuments::ExampleAppDocuments(ExampleAppDocuments *this)

{
  ImVec4 *pIVar1;
  MyDocument *pMVar2;
  MyDocument *pMVar3;
  int iVar4;
  int iVar5;
  
  (this->Documents).Size = 0;
  (this->Documents).Capacity = 0;
  (this->Documents).Data = (MyDocument *)0x0;
  pMVar2 = (MyDocument *)ImGui::MemAlloc(0x100);
  pMVar3 = (this->Documents).Data;
  if (pMVar3 != (MyDocument *)0x0) {
    memcpy(pMVar2,pMVar3,(long)(this->Documents).Size << 5);
    ImGui::MemFree((this->Documents).Data);
  }
  (this->Documents).Data = pMVar2;
  (this->Documents).Capacity = 8;
  iVar4 = (this->Documents).Size;
  pMVar2[iVar4].Name = "Lettuce";
  pMVar3 = pMVar2 + iVar4;
  pMVar3->Open = true;
  pMVar3->OpenPrev = true;
  pMVar3->Dirty = false;
  pMVar3->WantClose = false;
  pIVar1 = &pMVar2[iVar4].Color;
  pIVar1->x = 0.4;
  pIVar1->y = 0.8;
  pIVar1->z = 0.4;
  pIVar1->w = 1.0;
  iVar5 = (this->Documents).Size;
  iVar4 = iVar5 + 1;
  (this->Documents).Size = iVar4;
  if (iVar4 == (this->Documents).Capacity) {
    iVar5 = iVar5 + 2;
    if (iVar4 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar4 / 2 + iVar4;
    }
    if (iVar5 < iVar4) {
      iVar5 = iVar4;
    }
    pMVar3 = (MyDocument *)ImGui::MemAlloc((long)iVar5 << 5);
    pMVar2 = (this->Documents).Data;
    if (pMVar2 != (MyDocument *)0x0) {
      memcpy(pMVar3,pMVar2,(long)(this->Documents).Size << 5);
      ImGui::MemFree((this->Documents).Data);
    }
    (this->Documents).Data = pMVar3;
    (this->Documents).Capacity = iVar5;
    iVar4 = (this->Documents).Size;
  }
  else {
    pMVar3 = (this->Documents).Data;
  }
  pMVar3[iVar4].Name = "Eggplant";
  pMVar2 = pMVar3 + iVar4;
  pMVar2->Open = true;
  pMVar2->OpenPrev = true;
  pMVar2->Dirty = false;
  pMVar2->WantClose = false;
  pIVar1 = &pMVar3[iVar4].Color;
  pIVar1->x = 0.8;
  pIVar1->y = 0.5;
  pIVar1->z = 1.0;
  pIVar1->w = 1.0;
  iVar5 = (this->Documents).Size;
  iVar4 = iVar5 + 1;
  (this->Documents).Size = iVar4;
  if (iVar4 == (this->Documents).Capacity) {
    iVar5 = iVar5 + 2;
    if (iVar4 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar4 / 2 + iVar4;
    }
    if (iVar5 < iVar4) {
      iVar5 = iVar4;
    }
    pMVar3 = (MyDocument *)ImGui::MemAlloc((long)iVar5 << 5);
    pMVar2 = (this->Documents).Data;
    if (pMVar2 != (MyDocument *)0x0) {
      memcpy(pMVar3,pMVar2,(long)(this->Documents).Size << 5);
      ImGui::MemFree((this->Documents).Data);
    }
    (this->Documents).Data = pMVar3;
    (this->Documents).Capacity = iVar5;
    iVar4 = (this->Documents).Size;
  }
  else {
    pMVar3 = (this->Documents).Data;
  }
  pMVar3[iVar4].Name = "Carrot";
  pMVar2 = pMVar3 + iVar4;
  pMVar2->Open = true;
  pMVar2->OpenPrev = true;
  pMVar2->Dirty = false;
  pMVar2->WantClose = false;
  pIVar1 = &pMVar3[iVar4].Color;
  pIVar1->x = 1.0;
  pIVar1->y = 0.8;
  pIVar1->z = 0.5;
  pIVar1->w = 1.0;
  iVar5 = (this->Documents).Size;
  iVar4 = iVar5 + 1;
  (this->Documents).Size = iVar4;
  if (iVar4 == (this->Documents).Capacity) {
    iVar5 = iVar5 + 2;
    if (iVar4 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar4 / 2 + iVar4;
    }
    if (iVar5 < iVar4) {
      iVar5 = iVar4;
    }
    pMVar3 = (MyDocument *)ImGui::MemAlloc((long)iVar5 << 5);
    pMVar2 = (this->Documents).Data;
    if (pMVar2 != (MyDocument *)0x0) {
      memcpy(pMVar3,pMVar2,(long)(this->Documents).Size << 5);
      ImGui::MemFree((this->Documents).Data);
    }
    (this->Documents).Data = pMVar3;
    (this->Documents).Capacity = iVar5;
    iVar4 = (this->Documents).Size;
  }
  else {
    pMVar3 = (this->Documents).Data;
  }
  pMVar3[iVar4].Name = "Tomato";
  pMVar2 = pMVar3 + iVar4;
  pMVar2->Open = false;
  pMVar2->OpenPrev = false;
  pMVar2->Dirty = false;
  pMVar2->WantClose = false;
  pIVar1 = &pMVar3[iVar4].Color;
  pIVar1->x = 1.0;
  pIVar1->y = 0.3;
  pIVar1->z = 0.4;
  pIVar1->w = 1.0;
  iVar5 = (this->Documents).Size;
  iVar4 = iVar5 + 1;
  (this->Documents).Size = iVar4;
  if (iVar4 == (this->Documents).Capacity) {
    iVar5 = iVar5 + 2;
    if (iVar4 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar4 / 2 + iVar4;
    }
    if (iVar5 < iVar4) {
      iVar5 = iVar4;
    }
    pMVar3 = (MyDocument *)ImGui::MemAlloc((long)iVar5 << 5);
    pMVar2 = (this->Documents).Data;
    if (pMVar2 != (MyDocument *)0x0) {
      memcpy(pMVar3,pMVar2,(long)(this->Documents).Size << 5);
      ImGui::MemFree((this->Documents).Data);
    }
    (this->Documents).Data = pMVar3;
    (this->Documents).Capacity = iVar5;
    iVar4 = (this->Documents).Size;
  }
  else {
    pMVar3 = (this->Documents).Data;
  }
  pMVar3[iVar4].Name = "A Rather Long Title";
  pMVar2 = pMVar3 + iVar4;
  pMVar2->Open = false;
  pMVar2->OpenPrev = false;
  pMVar2->Dirty = false;
  pMVar2->WantClose = false;
  pIVar1 = &pMVar3[iVar4].Color;
  pIVar1->x = 1.0;
  pIVar1->y = 1.0;
  pIVar1->z = 1.0;
  pIVar1->w = 1.0;
  iVar5 = (this->Documents).Size;
  iVar4 = iVar5 + 1;
  (this->Documents).Size = iVar4;
  if (iVar4 == (this->Documents).Capacity) {
    iVar5 = iVar5 + 2;
    if (iVar4 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar4 / 2 + iVar4;
    }
    if (iVar5 < iVar4) {
      iVar5 = iVar4;
    }
    pMVar3 = (MyDocument *)ImGui::MemAlloc((long)iVar5 << 5);
    pMVar2 = (this->Documents).Data;
    if (pMVar2 != (MyDocument *)0x0) {
      memcpy(pMVar3,pMVar2,(long)(this->Documents).Size << 5);
      ImGui::MemFree((this->Documents).Data);
    }
    (this->Documents).Data = pMVar3;
    (this->Documents).Capacity = iVar5;
    iVar4 = (this->Documents).Size;
  }
  else {
    pMVar3 = (this->Documents).Data;
  }
  pMVar3[iVar4].Name = "Some Document";
  pMVar2 = pMVar3 + iVar4;
  pMVar2->Open = false;
  pMVar2->OpenPrev = false;
  pMVar2->Dirty = false;
  pMVar2->WantClose = false;
  pIVar1 = &pMVar3[iVar4].Color;
  pIVar1->x = 1.0;
  pIVar1->y = 1.0;
  pIVar1->z = 1.0;
  pIVar1->w = 1.0;
  (this->Documents).Size = (this->Documents).Size + 1;
  return;
}

Assistant:

ExampleAppDocuments()
    {
        Documents.push_back(MyDocument("Lettuce",             true,  ImVec4(0.4f, 0.8f, 0.4f, 1.0f)));
        Documents.push_back(MyDocument("Eggplant",            true,  ImVec4(0.8f, 0.5f, 1.0f, 1.0f)));
        Documents.push_back(MyDocument("Carrot",              true,  ImVec4(1.0f, 0.8f, 0.5f, 1.0f)));
        Documents.push_back(MyDocument("Tomato",              false, ImVec4(1.0f, 0.3f, 0.4f, 1.0f)));
        Documents.push_back(MyDocument("A Rather Long Title", false));
        Documents.push_back(MyDocument("Some Document",       false));
    }